

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O2

void display_before_exit(void)

{
  (*(currentdsp->device).exit)(currentdsp);
  return;
}

Assistant:

void display_before_exit(void) {

#ifdef TRUECOLOR
  truecolor_before_exit();
#endif /* TRUECOLOR */

  clear_display();

#if defined(XWINDOW) || defined(DOS)
  (currentdsp->device.exit)(currentdsp);
#endif /* DOS */
}